

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O2

Edge * __thiscall State::AddEdge(State *this,Rule *rule)

{
  Edge *edge;
  Edge *local_20;
  
  local_20 = (Edge *)operator_new(0x88);
  (local_20->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_20->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_20->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_20->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_20->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_20->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_20->validations_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_20->validations_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_20->validations_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20->dyndep_ = (Node *)0x0;
  *(undefined8 *)((long)&local_20->dyndep_ + 4) = 0;
  *(undefined8 *)((long)&local_20->env_ + 4) = 0;
  local_20->outputs_ready_ = false;
  local_20->deps_loaded_ = false;
  local_20->deps_missing_ = false;
  local_20->generated_by_dep_loader_ = false;
  local_20->implicit_deps_ = 0;
  local_20->order_only_deps_ = 0;
  local_20->implicit_outs_ = 0;
  local_20->rule_ = rule;
  local_20->pool_ = &kDefaultPool;
  local_20->env_ = &this->bindings_;
  local_20->id_ =
       (long)(this->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  std::vector<Edge_*,_std::allocator<Edge_*>_>::push_back(&this->edges_,&local_20);
  return local_20;
}

Assistant:

Edge* State::AddEdge(const Rule* rule) {
  Edge* edge = new Edge();
  edge->rule_ = rule;
  edge->pool_ = &State::kDefaultPool;
  edge->env_ = &bindings_;
  edge->id_ = edges_.size();
  edges_.push_back(edge);
  return edge;
}